

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_confined.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_pad_dists(Omega_h *this,Mesh *mesh,Int pad_dim,Read<signed_char> *edges_are_bridges)

{
  Mesh *pMVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar3;
  Reals RVar4;
  Read<signed_char> local_98;
  Read<signed_char> local_88;
  Read<signed_char> local_78;
  Read<signed_char> local_68;
  Read<signed_char> local_58 [2];
  Read<signed_char> local_38;
  Read<signed_char> *local_28;
  Read<signed_char> *edges_are_bridges_local;
  Mesh *pMStack_18;
  Int pad_dim_local;
  Mesh *mesh_local;
  
  local_28 = edges_are_bridges;
  edges_are_bridges_local._4_4_ = pad_dim;
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  if (pad_dim == 1) {
    IVar2 = Mesh::dim(mesh);
    pMVar1 = pMStack_18;
    if (IVar2 == 3) {
      Read<signed_char>::Read(&local_38,edges_are_bridges);
      get_edge_pad_dists<3>(this,pMVar1,&local_38);
      Read<signed_char>::~Read(&local_38);
      pvVar3 = extraout_RDX;
    }
    else {
      IVar2 = Mesh::dim(pMStack_18);
      pMVar1 = pMStack_18;
      if (IVar2 == 2) {
        Read<signed_char>::Read(local_58,edges_are_bridges);
        get_edge_pad_dists<2>(this,pMVar1,local_58);
        Read<signed_char>::~Read(local_58);
        pvVar3 = extraout_RDX_00;
      }
      else {
        IVar2 = Mesh::dim(pMStack_18);
        pMVar1 = pMStack_18;
        if (IVar2 != 1) goto LAB_003dd6fa;
        Read<signed_char>::Read(&local_68,edges_are_bridges);
        get_edge_pad_dists<1>(this,pMVar1,&local_68);
        Read<signed_char>::~Read(&local_68);
        pvVar3 = extraout_RDX_01;
      }
    }
  }
  else if (pad_dim == 2) {
    IVar2 = Mesh::dim(mesh);
    pMVar1 = pMStack_18;
    if (IVar2 == 3) {
      Read<signed_char>::Read(&local_78,edges_are_bridges);
      get_tri_pad_dists<3>(this,pMVar1,&local_78);
      Read<signed_char>::~Read(&local_78);
      pvVar3 = extraout_RDX_02;
    }
    else {
      IVar2 = Mesh::dim(pMStack_18);
      pMVar1 = pMStack_18;
      if (IVar2 != 2) goto LAB_003dd6fa;
      Read<signed_char>::Read(&local_88,edges_are_bridges);
      get_tri_pad_dists<2>(this,pMVar1,&local_88);
      Read<signed_char>::~Read(&local_88);
      pvVar3 = extraout_RDX_03;
    }
  }
  else {
    if (pad_dim != 3) {
LAB_003dd6fa:
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_confined.cpp"
           ,0xb5);
    }
    Read<signed_char>::Read(&local_98,edges_are_bridges);
    get_tet_pad_dists(this,mesh,&local_98);
    Read<signed_char>::~Read(&local_98);
    pvVar3 = extraout_RDX_04;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_pad_dists(Mesh* mesh, Int pad_dim, Read<I8> edges_are_bridges) {
  if (pad_dim == EDGE) {
    if (mesh->dim() == 3) {
      return get_edge_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_edge_pad_dists<2>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 1) {
      return get_edge_pad_dists<1>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == FACE) {
    if (mesh->dim() == 3) {
      return get_tri_pad_dists<3>(mesh, edges_are_bridges);
    } else if (mesh->dim() == 2) {
      return get_tri_pad_dists<2>(mesh, edges_are_bridges);
    }
  } else if (pad_dim == REGION) {
    return get_tet_pad_dists(mesh, edges_are_bridges);
  }
  OMEGA_H_NORETURN(Reals());
}